

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O2

int kvtree_open(char *file,int flags,...)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  int iVar5;
  va_list ap;
  uint local_d8;
  
  if ((flags & 0x40U) == 0) {
    local_d8 = 0;
    iVar2 = open(file,flags);
  }
  else {
    iVar2 = open(file,flags,(ulong)local_d8);
  }
  if (iVar2 < 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    pcVar4 = strerror(uVar1);
    kvtree_dbg(1,"Opening file: open(%s) errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0x5a);
    for (iVar5 = -5; (iVar2 < 0 && (iVar5 != 0)); iVar5 = iVar5 + 1) {
      usleep(100);
      if ((flags & 0x40U) == 0) {
        iVar2 = open(file,flags);
      }
      else {
        iVar2 = open(file,flags,(ulong)local_d8);
      }
    }
    if (iVar2 < 0) {
      uVar1 = *puVar3;
      pcVar4 = strerror(uVar1);
      kvtree_err("Opening file: open(%s) errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                 ,0x6c);
    }
  }
  return iVar2;
}

Assistant:

int kvtree_open(const char* file, int flags, ...)
{
  /* extract the mode (see man 2 open) */
  int mode_set = 0;
  mode_t mode = 0;
  if (flags & O_CREAT) {
    va_list ap;
    va_start(ap, flags);
    mode = va_arg(ap, mode_t);
    va_end(ap);
    mode_set = 1;
  }

  int fd = -1;
  if (mode_set) {
    fd = open(file, flags, mode);
  } else {
    fd = open(file, flags);
  }
  if (fd < 0) {
    kvtree_dbg(1, "Opening file: open(%s) errno=%d %s @ %s:%d",
      file, errno, strerror(errno), __FILE__, __LINE__
    );

    /* try again */
    int tries = KVTREE_OPEN_TRIES;
    while (tries && fd < 0) {
      usleep(KVTREE_OPEN_USLEEP);
      if (mode_set) {
        fd = open(file, flags, mode);
      } else {
        fd = open(file, flags);
      }
      tries--;
    }

    /* if we still don't have a valid file, consider it an error */
    if (fd < 0) {
      kvtree_err("Opening file: open(%s) errno=%d %s @ %s:%d",
        file, errno, strerror(errno), __FILE__, __LINE__
      );
    }
  }
  return fd;
}